

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry *
NscBuildStructDeclarationList(CNscPStackEntry *pList,CNscPStackEntry *pDeclaration)

{
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    CNscPStackEntry::SetType(pList,NscType_Unknown);
  }
  if (pList->m_nType != NscType_Error) {
    if (pDeclaration->m_nType == NscType_Error) {
      CNscPStackEntry::SetType(pList,NscType_Error);
    }
    else {
      CNscPStackEntry::AppendData(pList,pDeclaration->m_pauchData,pDeclaration->m_nDataSize);
    }
  }
  CNwnDoubleLinkList::InsertAfter(&pDeclaration->m_link,&g_pCtx->m_listEntryFree);
  return pList;
}

Assistant:

YYSTYPE NscBuildStructDeclarationList (YYSTYPE pList, YYSTYPE pDeclaration)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the parameter
	//

	CNscPStackEntry *pDeclarationEntry = pDeclaration;
	if (pOut ->GetType () != NscType_Error)
	{
		if (pDeclarationEntry ->GetType () != NscType_Error)
		{
			pOut ->AppendData (pDeclarationEntry ->GetData (),
				pDeclarationEntry ->GetDataSize ());
		}
		else
			pOut ->SetType (NscType_Error);
	}
	g_pCtx ->FreePStackEntry (pDeclarationEntry);


	//
	// Return the new expression
	//

	return pOut;
}